

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  NodeRef root;
  Geometry *pGVar1;
  size_t k;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  vfloat<4> vVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  undefined4 uVar9;
  int iVar10;
  RTCIntersectArguments *pRVar11;
  ulong uVar12;
  Intersectors *pIVar13;
  Intersectors *pIVar14;
  long lVar15;
  ulong uVar16;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar17;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar18;
  uint uVar19;
  NodeRef *pNVar20;
  bool bVar21;
  float fVar22;
  float fVar32;
  float fVar33;
  vint4 bi_1;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar34;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar35;
  float fVar43;
  float fVar45;
  vint4 bi;
  float fVar36;
  float fVar44;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar41;
  undefined1 auVar42 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  vint4 ai;
  float fVar52;
  float fVar53;
  float fVar55;
  float fVar56;
  vint4 ai_1;
  float fVar57;
  undefined1 auVar54 [16];
  float fVar58;
  float fVar60;
  float fVar61;
  vint4 ai_3;
  undefined1 auVar59 [16];
  float fVar62;
  uint uVar66;
  uint uVar67;
  vint4 bi_2;
  undefined1 auVar63 [16];
  uint uVar68;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar69;
  float fVar73;
  float fVar74;
  vint4 bi_3;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar75;
  undefined1 auVar72 [16];
  uint uVar76;
  uint uVar77;
  uint uVar78;
  vint4 ai_2;
  uint uVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint uVar82;
  uint uVar83;
  uint uVar84;
  uint uVar85;
  uint uVar86;
  uint uVar87;
  uint uVar88;
  uint uVar89;
  uint uVar90;
  uint uVar91;
  uint uVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  TravRayK<4,_false> *tray_00;
  Precalculations pre;
  uint local_18f8;
  uint uStack_18f4;
  uint uStack_18f0;
  uint uStack_18ec;
  vbool<4> terminated;
  float local_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  TravRayK<4,_false> tray;
  float local_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float local_16e8;
  float fStack_16e4;
  float fStack_16e0;
  float fStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar42 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    pRVar11 = (RTCIntersectArguments *)context;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pRVar11 = context->args, ((ulong)*(Scene **)&pRVar11->flags & 0x10000) != 0)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar38 = *(undefined1 (*) [16])(ray + 0x80);
    auVar59._0_12_ = ZEXT812(0);
    auVar59._12_4_ = 0;
    uVar82 = -(uint)(0.0 <= auVar38._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar83 = -(uint)(0.0 <= auVar38._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar85 = -(uint)(0.0 <= auVar38._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar87 = -(uint)(0.0 <= auVar38._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar24._4_4_ = uVar83;
    auVar24._0_4_ = uVar82;
    auVar24._8_4_ = uVar85;
    auVar24._12_4_ = uVar87;
    iVar8 = movmskps((int)pRVar11,auVar24);
    if (iVar8 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar35 = (float)DAT_01ff1d40;
      fVar43 = DAT_01ff1d40._4_4_;
      fVar45 = DAT_01ff1d40._8_4_;
      fVar47 = DAT_01ff1d40._12_4_;
      auVar63._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar43);
      auVar63._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar35);
      auVar63._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar45);
      auVar63._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar47);
      auVar80 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01ff1d40,auVar63)
      ;
      auVar70._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar43);
      auVar70._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar35);
      auVar70._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar45);
      auVar70._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar47);
      auVar70 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01ff1d40,auVar70)
      ;
      auVar23._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar43);
      auVar23._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar35);
      auVar23._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar45);
      auVar23._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar47);
      auVar63 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01ff1d40,auVar23)
      ;
      auVar24 = rcpps(auVar23,auVar80);
      fVar35 = auVar24._0_4_;
      auVar81._0_4_ = auVar80._0_4_ * fVar35;
      fVar43 = auVar24._4_4_;
      auVar81._4_4_ = auVar80._4_4_ * fVar43;
      fVar45 = auVar24._8_4_;
      auVar81._8_4_ = auVar80._8_4_ * fVar45;
      fVar47 = auVar24._12_4_;
      auVar81._12_4_ = auVar80._12_4_ * fVar47;
      tray.rdir.field_0._0_4_ = (1.0 - auVar81._0_4_) * fVar35 + fVar35;
      tray.rdir.field_0._4_4_ = (1.0 - auVar81._4_4_) * fVar43 + fVar43;
      tray.rdir.field_0._8_4_ = (1.0 - auVar81._8_4_) * fVar45 + fVar45;
      tray.rdir.field_0._12_4_ = (1.0 - auVar81._12_4_) * fVar47 + fVar47;
      auVar24 = rcpps(auVar81,auVar70);
      fVar35 = auVar24._0_4_;
      auVar71._0_4_ = auVar70._0_4_ * fVar35;
      fVar43 = auVar24._4_4_;
      auVar71._4_4_ = auVar70._4_4_ * fVar43;
      fVar45 = auVar24._8_4_;
      auVar71._8_4_ = auVar70._8_4_ * fVar45;
      fVar47 = auVar24._12_4_;
      auVar71._12_4_ = auVar70._12_4_ * fVar47;
      tray.rdir.field_0._16_4_ = (1.0 - auVar71._0_4_) * fVar35 + fVar35;
      tray.rdir.field_0._20_4_ = (1.0 - auVar71._4_4_) * fVar43 + fVar43;
      tray.rdir.field_0._24_4_ = (1.0 - auVar71._8_4_) * fVar45 + fVar45;
      tray.rdir.field_0._28_4_ = (1.0 - auVar71._12_4_) * fVar47 + fVar47;
      auVar24 = rcpps(auVar71,auVar63);
      fVar35 = auVar24._0_4_;
      fVar43 = auVar24._4_4_;
      fVar45 = auVar24._8_4_;
      fVar47 = auVar24._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar63._0_4_ * fVar35) * fVar35 + fVar35;
      tray.rdir.field_0._36_4_ = (1.0 - auVar63._4_4_ * fVar43) * fVar43 + fVar43;
      tray.rdir.field_0._40_4_ = (1.0 - auVar63._8_4_ * fVar45) * fVar45 + fVar45;
      tray.rdir.field_0._44_4_ = (1.0 - auVar63._12_4_ * fVar47) * fVar47 + fVar47;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar80._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar80._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar80._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar80._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar80);
      auVar25._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar25._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar25._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar25._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar25);
      auVar63 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar59);
      auVar24 = maxps(auVar38,auVar59);
      fVar35 = (float)DAT_01feb9f0;
      fVar43 = DAT_01feb9f0._4_4_;
      fVar45 = DAT_01feb9f0._8_4_;
      fVar47 = DAT_01feb9f0._12_4_;
      auVar38._4_4_ = uVar83;
      auVar38._0_4_ = uVar82;
      auVar38._8_4_ = uVar85;
      auVar38._12_4_ = uVar87;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feb9f0,auVar63,auVar38);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feba00,auVar24,auVar38);
      terminated.field_0._0_8_ = CONCAT44(uVar83,uVar82) ^ 0xffffffffffffffff;
      terminated.field_0.i[2] = uVar85 ^ 0xffffffff;
      terminated.field_0.i[3] = uVar87 ^ 0xffffffff;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar19 = 3;
      }
      else {
        uVar19 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar20 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01feb9f0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      iVar8 = 0x224ff80;
      paVar17 = &stack_near[2].field_0;
LAB_0023c225:
      paVar18 = paVar17 + -1;
      root.ptr = pNVar20[-1].ptr;
      pNVar20 = pNVar20 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0023c882;
      local_18d8 = paVar18->v[0];
      fStack_18d4 = *(float *)((long)paVar17 + -0xc);
      fStack_18d0 = *(float *)((long)paVar17 + -8);
      fStack_18cc = *(float *)((long)paVar17 + -4);
      vVar5.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18->v;
      auVar26._4_4_ = -(uint)(fStack_18d4 < tray.tfar.field_0.v[1]);
      auVar26._0_4_ = -(uint)(local_18d8 < tray.tfar.field_0.v[0]);
      auVar26._8_4_ = -(uint)(fStack_18d0 < tray.tfar.field_0.v[2]);
      auVar26._12_4_ = -(uint)(fStack_18cc < tray.tfar.field_0.v[3]);
      uVar6 = movmskps(iVar8,auVar26);
      if (uVar6 == 0) {
LAB_0023c893:
        iVar8 = 2;
      }
      else {
        uVar7 = (ulong)(uVar6 & 0xff);
        uVar6 = POPCOUNT(uVar6 & 0xff);
        iVar8 = 0;
        if (uVar6 <= uVar19) {
          do {
            k = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> k & 1) == 0; k = k + 1) {
              }
            }
            tray_00 = &tray;
            valid_i = (vint<4> *)This;
            bVar21 = occluded1(This,bvh,root,k,&pre,ray,tray_00,context);
            if (bVar21) {
              terminated.field_0.i[k] = -1;
            }
            uVar7 = uVar7 & uVar7 - 1;
          } while (uVar7 != 0);
          iVar10 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
          iVar8 = 3;
          fVar35 = INFINITY;
          fVar43 = INFINITY;
          fVar45 = INFINITY;
          fVar47 = INFINITY;
          local_18d8 = vVar5.field_0._0_4_;
          fStack_18d4 = vVar5.field_0._4_4_;
          fStack_18d0 = vVar5.field_0._8_4_;
          fStack_18cc = vVar5.field_0._12_4_;
          if (iVar10 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                          (undefined1  [16])terminated.field_0);
            iVar8 = 2;
          }
        }
        if (uVar19 < uVar6) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0023c882;
              auVar29._4_4_ = -(uint)(fStack_18d4 < tray.tfar.field_0.v[1]);
              auVar29._0_4_ = -(uint)(local_18d8 < tray.tfar.field_0.v[0]);
              auVar29._8_4_ = -(uint)(fStack_18d0 < tray.tfar.field_0.v[2]);
              auVar29._12_4_ = -(uint)(fStack_18cc < tray.tfar.field_0.v[3]);
              iVar8 = movmskps(iVar8,auVar29);
              if (iVar8 == 0) goto LAB_0023c893;
              uVar7 = (ulong)((uint)root.ptr & 0xf) - 8;
              aVar41 = terminated.field_0;
              if (uVar7 == 0) goto LAB_0023c855;
              auVar39._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar39._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              auVar39._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              lVar15 = (root.ptr & 0xfffffffffffffff0) + 0x90;
              uVar12 = 0;
              goto LAB_0023c503;
            }
            pIVar13 = (Intersectors *)0x0;
            uVar7 = 8;
            local_18d8 = fVar35;
            fStack_18d4 = fVar43;
            fStack_18d0 = fVar45;
            fStack_18cc = fVar47;
            do {
              uVar12 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + (long)pIVar13 * 8);
              if (uVar12 != 8) {
                fVar75 = *(float *)(root.ptr + 0x20 + (long)pIVar13 * 4);
                fVar22 = *(float *)(root.ptr + 0x30 + (long)pIVar13 * 4);
                fVar32 = *(float *)(root.ptr + 0x40 + (long)pIVar13 * 4);
                fVar34 = *(float *)(root.ptr + 0x50 + (long)pIVar13 * 4);
                fVar49 = (fVar75 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
                fVar50 = (fVar75 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
                fVar51 = (fVar75 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
                fVar52 = (fVar75 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_
                ;
                fVar53 = (fVar32 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_
                ;
                fVar55 = (fVar32 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_
                ;
                fVar56 = (fVar32 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_
                ;
                fVar57 = (fVar32 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_
                ;
                fVar75 = *(float *)(root.ptr + 0x60 + (long)pIVar13 * 4);
                fVar58 = (fVar75 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_
                ;
                fVar60 = (fVar75 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_
                ;
                fVar61 = (fVar75 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_
                ;
                fVar62 = (fVar75 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_
                ;
                fVar36 = (fVar22 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
                fVar44 = (fVar22 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
                fVar46 = (fVar22 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
                fVar48 = (fVar22 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_
                ;
                fVar22 = (fVar34 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_
                ;
                fVar32 = (fVar34 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_
                ;
                fVar33 = (fVar34 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_
                ;
                fVar34 = (fVar34 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_
                ;
                fVar75 = *(float *)(root.ptr + 0x70 + (long)pIVar13 * 4);
                fVar69 = (fVar75 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_
                ;
                fVar73 = (fVar75 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_
                ;
                fVar74 = (fVar75 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_
                ;
                fVar75 = (fVar75 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_
                ;
                uVar6 = (uint)((int)fVar36 < (int)fVar49) * (int)fVar36 |
                        (uint)((int)fVar36 >= (int)fVar49) * (int)fVar49;
                uVar66 = (uint)((int)fVar44 < (int)fVar50) * (int)fVar44 |
                         (uint)((int)fVar44 >= (int)fVar50) * (int)fVar50;
                uVar67 = (uint)((int)fVar46 < (int)fVar51) * (int)fVar46 |
                         (uint)((int)fVar46 >= (int)fVar51) * (int)fVar51;
                uVar68 = (uint)((int)fVar48 < (int)fVar52) * (int)fVar48 |
                         (uint)((int)fVar48 >= (int)fVar52) * (int)fVar52;
                uVar76 = (uint)((int)fVar22 < (int)fVar53) * (int)fVar22 |
                         (uint)((int)fVar22 >= (int)fVar53) * (int)fVar53;
                uVar77 = (uint)((int)fVar32 < (int)fVar55) * (int)fVar32 |
                         (uint)((int)fVar32 >= (int)fVar55) * (int)fVar55;
                uVar78 = (uint)((int)fVar33 < (int)fVar56) * (int)fVar33 |
                         (uint)((int)fVar33 >= (int)fVar56) * (int)fVar56;
                uVar79 = (uint)((int)fVar34 < (int)fVar57) * (int)fVar34 |
                         (uint)((int)fVar34 >= (int)fVar57) * (int)fVar57;
                uVar76 = ((int)uVar76 < (int)uVar6) * uVar6 | ((int)uVar76 >= (int)uVar6) * uVar76;
                uVar77 = ((int)uVar77 < (int)uVar66) * uVar66 |
                         ((int)uVar77 >= (int)uVar66) * uVar77;
                uVar78 = ((int)uVar78 < (int)uVar67) * uVar67 |
                         ((int)uVar78 >= (int)uVar67) * uVar78;
                uVar79 = ((int)uVar79 < (int)uVar68) * uVar68 |
                         ((int)uVar79 >= (int)uVar68) * uVar79;
                uVar6 = (uint)((int)fVar69 < (int)fVar58) * (int)fVar69 |
                        (uint)((int)fVar69 >= (int)fVar58) * (int)fVar58;
                uVar66 = (uint)((int)fVar73 < (int)fVar60) * (int)fVar73 |
                         (uint)((int)fVar73 >= (int)fVar60) * (int)fVar60;
                uVar67 = (uint)((int)fVar74 < (int)fVar61) * (int)fVar74 |
                         (uint)((int)fVar74 >= (int)fVar61) * (int)fVar61;
                uVar68 = (uint)((int)fVar75 < (int)fVar62) * (int)fVar75 |
                         (uint)((int)fVar75 >= (int)fVar62) * (int)fVar62;
                auVar64._0_4_ =
                     ((int)uVar6 < (int)uVar76) * uVar76 | ((int)uVar6 >= (int)uVar76) * uVar6;
                auVar64._4_4_ =
                     ((int)uVar66 < (int)uVar77) * uVar77 | ((int)uVar66 >= (int)uVar77) * uVar66;
                auVar64._8_4_ =
                     ((int)uVar67 < (int)uVar78) * uVar78 | ((int)uVar67 >= (int)uVar78) * uVar67;
                auVar64._12_4_ =
                     ((int)uVar68 < (int)uVar79) * uVar79 | ((int)uVar68 >= (int)uVar79) * uVar68;
                uVar76 = (uint)((int)fVar36 < (int)fVar49) * (int)fVar49 |
                         (uint)((int)fVar36 >= (int)fVar49) * (int)fVar36;
                uVar77 = (uint)((int)fVar44 < (int)fVar50) * (int)fVar50 |
                         (uint)((int)fVar44 >= (int)fVar50) * (int)fVar44;
                uVar78 = (uint)((int)fVar46 < (int)fVar51) * (int)fVar51 |
                         (uint)((int)fVar46 >= (int)fVar51) * (int)fVar46;
                uVar79 = (uint)((int)fVar48 < (int)fVar52) * (int)fVar52 |
                         (uint)((int)fVar48 >= (int)fVar52) * (int)fVar48;
                uVar6 = (uint)((int)fVar22 < (int)fVar53) * (int)fVar53 |
                        (uint)((int)fVar22 >= (int)fVar53) * (int)fVar22;
                uVar66 = (uint)((int)fVar32 < (int)fVar55) * (int)fVar55 |
                         (uint)((int)fVar32 >= (int)fVar55) * (int)fVar32;
                uVar67 = (uint)((int)fVar33 < (int)fVar56) * (int)fVar56 |
                         (uint)((int)fVar33 >= (int)fVar56) * (int)fVar33;
                uVar68 = (uint)((int)fVar34 < (int)fVar57) * (int)fVar57 |
                         (uint)((int)fVar34 >= (int)fVar57) * (int)fVar34;
                uVar6 = ((int)uVar76 < (int)uVar6) * uVar76 | ((int)uVar76 >= (int)uVar6) * uVar6;
                uVar66 = ((int)uVar77 < (int)uVar66) * uVar77 |
                         ((int)uVar77 >= (int)uVar66) * uVar66;
                uVar67 = ((int)uVar78 < (int)uVar67) * uVar78 |
                         ((int)uVar78 >= (int)uVar67) * uVar67;
                uVar68 = ((int)uVar79 < (int)uVar68) * uVar79 |
                         ((int)uVar79 >= (int)uVar68) * uVar68;
                uVar76 = (uint)((int)fVar69 < (int)fVar58) * (int)fVar58 |
                         (uint)((int)fVar69 >= (int)fVar58) * (int)fVar69;
                uVar77 = (uint)((int)fVar73 < (int)fVar60) * (int)fVar60 |
                         (uint)((int)fVar73 >= (int)fVar60) * (int)fVar73;
                uVar78 = (uint)((int)fVar74 < (int)fVar61) * (int)fVar61 |
                         (uint)((int)fVar74 >= (int)fVar61) * (int)fVar74;
                uVar79 = (uint)((int)fVar75 < (int)fVar62) * (int)fVar62 |
                         (uint)((int)fVar75 >= (int)fVar62) * (int)fVar75;
                uVar6 = ((int)uVar6 < (int)uVar76) * uVar6 | ((int)uVar6 >= (int)uVar76) * uVar76;
                uVar66 = ((int)uVar66 < (int)uVar77) * uVar66 |
                         ((int)uVar66 >= (int)uVar77) * uVar77;
                uVar67 = ((int)uVar67 < (int)uVar78) * uVar67 |
                         ((int)uVar67 >= (int)uVar78) * uVar78;
                uVar68 = ((int)uVar68 < (int)uVar79) * uVar68 |
                         ((int)uVar68 >= (int)uVar79) * uVar79;
                auVar27._4_4_ =
                     -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar64._4_4_) * auVar64._4_4_
                                    | (uint)(tray.tnear.field_0.i[1] >= (int)auVar64._4_4_) *
                                      tray.tnear.field_0.i[1]) <=
                            (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar66) *
                                    tray.tfar.field_0.i[1] |
                                   (tray.tfar.field_0.i[1] >= (int)uVar66) * uVar66));
                auVar27._0_4_ =
                     -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar64._0_4_) * auVar64._0_4_
                                    | (uint)(tray.tnear.field_0.i[0] >= (int)auVar64._0_4_) *
                                      tray.tnear.field_0.i[0]) <=
                            (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar6) *
                                    tray.tfar.field_0.i[0] |
                                   (tray.tfar.field_0.i[0] >= (int)uVar6) * uVar6));
                auVar27._8_4_ =
                     -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar64._8_4_) * auVar64._8_4_
                                    | (uint)(tray.tnear.field_0.i[2] >= (int)auVar64._8_4_) *
                                      tray.tnear.field_0.i[2]) <=
                            (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar67) *
                                    tray.tfar.field_0.i[2] |
                                   (tray.tfar.field_0.i[2] >= (int)uVar67) * uVar67));
                auVar27._12_4_ =
                     -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar64._12_4_) *
                                     auVar64._12_4_ |
                                    (uint)(tray.tnear.field_0.i[3] >= (int)auVar64._12_4_) *
                                    tray.tnear.field_0.i[3]) <=
                            (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar68) *
                                    tray.tfar.field_0.i[3] |
                                   (tray.tfar.field_0.i[3] >= (int)uVar68) * uVar68));
                uVar6 = movmskps((int)valid_i,auVar27);
                valid_i = (vint<4> *)(ulong)uVar6;
                if (uVar6 != 0) {
                  auVar37._4_4_ = fVar43;
                  auVar37._0_4_ = fVar35;
                  auVar37._8_4_ = fVar45;
                  auVar37._12_4_ = fVar47;
                  auVar38 = blendvps(auVar37,auVar64,auVar27);
                  if (uVar7 != 8) {
                    pNVar20->ptr = uVar7;
                    pNVar20 = pNVar20 + 1;
                    paVar18->v[0] = local_18d8;
                    paVar18->v[1] = fStack_18d4;
                    paVar18->v[2] = fStack_18d0;
                    paVar18->v[3] = fStack_18cc;
                    paVar18 = paVar18 + 1;
                  }
                  local_18d8 = auVar38._0_4_;
                  fStack_18d4 = auVar38._4_4_;
                  fStack_18d0 = auVar38._8_4_;
                  fStack_18cc = auVar38._12_4_;
                  uVar7 = uVar12;
                }
              }
            } while ((uVar12 != 8) &&
                    (valid_i = (vint<4> *)((long)&pIVar13->ptr + 1),
                    bVar21 = pIVar13 < (Intersectors *)0x3, pIVar13 = (Intersectors *)valid_i,
                    bVar21));
            iVar8 = 0;
            if (uVar7 == 8) {
LAB_0023c41d:
              bVar21 = false;
              iVar8 = 4;
            }
            else {
              auVar28._4_4_ = -(uint)(fStack_18d4 < tray.tfar.field_0.v[1]);
              auVar28._0_4_ = -(uint)(local_18d8 < tray.tfar.field_0.v[0]);
              auVar28._8_4_ = -(uint)(fStack_18d0 < tray.tfar.field_0.v[2]);
              auVar28._12_4_ = -(uint)(fStack_18cc < tray.tfar.field_0.v[3]);
              uVar9 = movmskps((int)(root.ptr & 0xfffffffffffffff0),auVar28);
              bVar21 = true;
              if ((uint)POPCOUNT(uVar9) <= uVar19) {
                pNVar20->ptr = uVar7;
                pNVar20 = pNVar20 + 1;
                paVar18->v[0] = local_18d8;
                paVar18->v[1] = fStack_18d4;
                paVar18->v[2] = fStack_18d0;
                paVar18->v[3] = fStack_18cc;
                paVar18 = paVar18 + 1;
                goto LAB_0023c41d;
              }
            }
            root.ptr = uVar7;
          } while (bVar21);
        }
      }
      goto LAB_0023c885;
    }
  }
  return;
  while( true ) {
    uVar12 = uVar12 + 1;
    lVar15 = lVar15 + 0xb0;
    auVar39 = auVar40;
    if (uVar7 <= uVar12) break;
LAB_0023c503:
    pIVar13 = (Intersectors *)0x0;
    auVar65 = auVar39;
    while (uVar16 = (ulong)*(uint *)(lVar15 + (long)pIVar13 * 4), pIVar14 = pIVar13,
          uVar16 != 0xffffffff) {
      fVar35 = *(float *)(lVar15 + -0x90 + (long)pIVar13 * 4);
      fVar43 = *(float *)(lVar15 + -0x80 + (long)pIVar13 * 4);
      fVar45 = *(float *)(lVar15 + -0x70 + (long)pIVar13 * 4);
      local_16e8 = (float)*(undefined8 *)ray;
      fStack_16e4 = (float)((ulong)*(undefined8 *)ray >> 0x20);
      fStack_16e0 = (float)*(undefined8 *)(ray + 8);
      fStack_16dc = (float)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      local_16e8 = fVar35 - local_16e8;
      fStack_16e4 = fVar35 - fStack_16e4;
      fStack_16e0 = fVar35 - fStack_16e0;
      fVar35 = fVar35 - fStack_16dc;
      local_16f8 = (float)*(undefined8 *)(ray + 0x10);
      fStack_16f4 = (float)((ulong)*(undefined8 *)(ray + 0x10) >> 0x20);
      fStack_16f0 = (float)*(undefined8 *)(ray + 0x18);
      fStack_16ec = (float)((ulong)*(undefined8 *)(ray + 0x18) >> 0x20);
      local_16f8 = fVar43 - local_16f8;
      fStack_16f4 = fVar43 - fStack_16f4;
      fStack_16f0 = fVar43 - fStack_16f0;
      fVar43 = fVar43 - fStack_16ec;
      local_1708 = (float)*(undefined8 *)(ray + 0x20);
      fStack_1704 = (float)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      fStack_1700 = (float)*(undefined8 *)(ray + 0x28);
      fStack_16fc = (float)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      local_1708 = fVar45 - local_1708;
      fStack_1704 = fVar45 - fStack_1704;
      fStack_1700 = fVar45 - fStack_1700;
      fVar45 = fVar45 - fStack_16fc;
      fVar47 = *(float *)(lVar15 + -0x60 + (long)pIVar13 * 4);
      fVar75 = *(float *)(lVar15 + -0x50 + (long)pIVar13 * 4);
      fVar22 = *(float *)(lVar15 + -0x40 + (long)pIVar13 * 4);
      fVar32 = *(float *)(lVar15 + -0x30 + (long)pIVar13 * 4);
      fVar34 = *(float *)(lVar15 + -0x20 + (long)pIVar13 * 4);
      fVar33 = *(float *)(lVar15 + -0x10 + (long)pIVar13 * 4);
      fVar48 = fVar22 * fVar34 - fVar75 * fVar33;
      fVar55 = fVar33 * fVar47 - fVar22 * fVar32;
      fVar49 = fVar32 * fVar75 - fVar34 * fVar47;
      local_1718 = (float)*(undefined8 *)(ray + 0x50);
      fStack_1714 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      fStack_1710 = (float)*(undefined8 *)(ray + 0x58);
      fStack_170c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      local_1728 = (float)*(undefined8 *)(ray + 0x60);
      fStack_1724 = (float)((ulong)*(undefined8 *)(ray + 0x60) >> 0x20);
      fStack_1720 = (float)*(undefined8 *)(ray + 0x68);
      fStack_171c = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      fVar61 = local_16f8 * local_1728 - local_1708 * local_1718;
      fVar62 = fStack_16f4 * fStack_1724 - fStack_1704 * fStack_1714;
      fVar69 = fStack_16f0 * fStack_1720 - fStack_1700 * fStack_1710;
      fVar73 = fVar43 * fStack_171c - fVar45 * fStack_170c;
      local_1738 = (float)*(undefined8 *)(ray + 0x40);
      fStack_1734 = (float)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
      fStack_1730 = (float)*(undefined8 *)(ray + 0x48);
      fStack_172c = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      fVar74 = local_1708 * local_1738 - local_16e8 * local_1728;
      fVar93 = fStack_1704 * fStack_1734 - fStack_16e4 * fStack_1724;
      fVar94 = fStack_1700 * fStack_1730 - fStack_16e0 * fStack_1720;
      fVar95 = fVar45 * fStack_172c - fVar35 * fStack_171c;
      fVar56 = local_16e8 * local_1718 - local_16f8 * local_1738;
      fVar57 = fStack_16e4 * fStack_1714 - fStack_16f4 * fStack_1734;
      fVar58 = fStack_16e0 * fStack_1710 - fStack_16f0 * fStack_1730;
      fVar60 = fVar35 * fStack_170c - fVar43 * fStack_172c;
      fVar50 = fVar48 * local_1738 + fVar55 * local_1718 + fVar49 * local_1728;
      fVar51 = fVar48 * fStack_1734 + fVar55 * fStack_1714 + fVar49 * fStack_1724;
      fVar52 = fVar48 * fStack_1730 + fVar55 * fStack_1710 + fVar49 * fStack_1720;
      fVar53 = fVar48 * fStack_172c + fVar55 * fStack_170c + fVar49 * fStack_171c;
      uVar79 = (uint)fVar50 & 0x80000000;
      uVar84 = (uint)fVar51 & 0x80000000;
      uVar86 = (uint)fVar52 & 0x80000000;
      uVar88 = (uint)fVar53 & 0x80000000;
      fVar36 = (float)((uint)(fVar32 * fVar61 + fVar34 * fVar74 + fVar33 * fVar56) ^ uVar79);
      fVar44 = (float)((uint)(fVar32 * fVar62 + fVar34 * fVar93 + fVar33 * fVar57) ^ uVar84);
      fVar46 = (float)((uint)(fVar32 * fVar69 + fVar34 * fVar94 + fVar33 * fVar58) ^ uVar86);
      fVar32 = (float)((uint)(fVar32 * fVar73 + fVar34 * fVar95 + fVar33 * fVar60) ^ uVar88);
      uVar76 = auVar65._0_4_;
      uVar77 = auVar65._8_4_;
      uVar78 = auVar65._12_4_;
      auVar72._0_4_ = -(uint)(0.0 <= fVar36) & uVar76;
      auVar72._4_4_ = -(uint)(0.0 <= fVar44) & auVar65._4_4_;
      auVar72._8_4_ = -(uint)(0.0 <= fVar46) & uVar77;
      auVar72._12_4_ = -(uint)(0.0 <= fVar32) & uVar78;
      iVar8 = movmskps((int)valid_i,auVar72);
      local_18f8 = auVar42._0_4_;
      uStack_18f4 = auVar42._4_4_;
      uStack_18f0 = auVar42._8_4_;
      uStack_18ec = auVar42._12_4_;
      uVar6 = local_18f8;
      uVar66 = uStack_18f4;
      uVar67 = uStack_18f0;
      uVar68 = uStack_18ec;
      if (iVar8 != 0) {
        fVar34 = (float)((uint)(fVar47 * fVar61 + fVar75 * fVar74 + fVar22 * fVar56) ^ uVar79);
        fVar33 = (float)((uint)(fVar47 * fVar62 + fVar75 * fVar93 + fVar22 * fVar57) ^ uVar84);
        fVar56 = (float)((uint)(fVar47 * fVar69 + fVar75 * fVar94 + fVar22 * fVar58) ^ uVar86);
        fVar47 = (float)((uint)(fVar47 * fVar73 + fVar75 * fVar95 + fVar22 * fVar60) ^ uVar88);
        uVar89 = -(uint)(0.0 <= fVar34) & auVar72._0_4_;
        uVar90 = -(uint)(0.0 <= fVar33) & auVar72._4_4_;
        uVar91 = -(uint)(0.0 <= fVar56) & auVar72._8_4_;
        uVar92 = -(uint)(0.0 <= fVar47) & auVar72._12_4_;
        auVar3._4_4_ = uVar90;
        auVar3._0_4_ = uVar89;
        auVar3._8_4_ = uVar91;
        auVar3._12_4_ = uVar92;
        iVar8 = movmskps(iVar8,auVar3);
        if (iVar8 != 0) {
          fVar75 = ABS(fVar50);
          fVar22 = ABS(fVar51);
          fVar57 = ABS(fVar52);
          fVar58 = ABS(fVar53);
          uVar89 = -(uint)(fVar34 <= fVar75 - fVar36) & uVar89;
          uVar90 = -(uint)(fVar33 <= fVar22 - fVar44) & uVar90;
          uVar91 = -(uint)(fVar56 <= fVar57 - fVar46) & uVar91;
          uVar92 = -(uint)(fVar47 <= fVar58 - fVar32) & uVar92;
          auVar4._4_4_ = uVar90;
          auVar4._0_4_ = uVar89;
          auVar4._8_4_ = uVar91;
          auVar4._12_4_ = uVar92;
          iVar8 = movmskps(iVar8,auVar4);
          if (iVar8 != 0) {
            fVar47 = (float)(uVar79 ^ (uint)(local_16e8 * fVar48 +
                                            local_16f8 * fVar55 + fVar49 * local_1708));
            fVar32 = (float)(uVar84 ^ (uint)(fStack_16e4 * fVar48 +
                                            fStack_16f4 * fVar55 + fVar49 * fStack_1704));
            fVar34 = (float)(uVar86 ^ (uint)(fStack_16e0 * fVar48 +
                                            fStack_16f0 * fVar55 + fVar49 * fStack_1700));
            fVar35 = (float)(uVar88 ^ (uint)(fVar35 * fVar48 + fVar43 * fVar55 + fVar49 * fVar45));
            local_1768 = (float)*(undefined8 *)(ray + 0x30);
            fStack_1764 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
            fStack_1760 = (float)*(undefined8 *)(ray + 0x38);
            fStack_175c = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
            local_1778 = (float)*(undefined8 *)(ray + 0x80);
            fStack_1774 = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
            fStack_1770 = (float)*(undefined8 *)(ray + 0x88);
            fStack_176c = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
            uVar89 = -(uint)(fVar47 <= fVar75 * local_1778 && fVar75 * local_1768 < fVar47) & uVar89
            ;
            uVar90 = -(uint)(fVar32 <= fVar22 * fStack_1774 && fVar22 * fStack_1764 < fVar32) &
                     uVar90;
            uVar91 = -(uint)(fVar34 <= fVar57 * fStack_1770 && fVar57 * fStack_1760 < fVar34) &
                     uVar91;
            uVar92 = -(uint)(fVar58 * fStack_175c < fVar35 && fVar35 <= fVar58 * fStack_176c) &
                     uVar92;
            auVar2._4_4_ = uVar90;
            auVar2._0_4_ = uVar89;
            auVar2._8_4_ = uVar91;
            auVar2._12_4_ = uVar92;
            iVar8 = movmskps(iVar8,auVar2);
            if (iVar8 != 0) {
              auVar54._0_4_ = -(uint)(fVar50 != 0.0) & uVar89;
              auVar54._4_4_ = -(uint)(fVar51 != 0.0) & uVar90;
              auVar54._8_4_ = -(uint)(fVar52 != 0.0) & uVar91;
              auVar54._12_4_ = -(uint)(fVar53 != 0.0) & uVar92;
              iVar8 = movmskps(iVar8,auVar54);
              uVar6 = auVar54._0_4_;
              uVar66 = auVar54._4_4_;
              uVar67 = auVar54._8_4_;
              uVar68 = auVar54._12_4_;
              if (iVar8 == 0) {
                uVar6 = local_18f8;
                uVar66 = uStack_18f4;
                uVar67 = uStack_18f0;
                uVar68 = uStack_18ec;
              }
            }
          }
        }
      }
      pGVar1 = (context->scene->geometries).items[uVar16].ptr;
      uVar79 = pGVar1->mask;
      auVar30._0_4_ = -(uint)((uVar79 & *(uint *)(ray + 0x90)) == 0);
      auVar30._4_4_ = -(uint)((uVar79 & *(uint *)(ray + 0x94)) == 0);
      auVar30._8_4_ = -(uint)((uVar79 & *(uint *)(ray + 0x98)) == 0);
      auVar30._12_4_ = -(uint)((uVar79 & *(uint *)(ray + 0x9c)) == 0);
      auVar31._4_4_ = uVar66;
      auVar31._0_4_ = uVar6;
      auVar31._8_4_ = uVar67;
      auVar31._12_4_ = uVar68;
      auVar31 = ~auVar30 & auVar31;
      iVar8 = movmskps((int)pGVar1,auVar31);
      if (iVar8 != 0) {
        auVar65._4_4_ = ~auVar31._4_4_ & auVar65._4_4_;
        auVar65._0_4_ = ~auVar31._0_4_ & uVar76;
        auVar65._8_4_ = ~auVar31._8_4_ & uVar77;
        auVar65._12_4_ = ~auVar31._12_4_ & uVar78;
      }
      fVar35 = INFINITY;
      fVar43 = INFINITY;
      fVar45 = INFINITY;
      fVar47 = INFINITY;
      uVar6 = movmskps(iVar8,auVar65);
      valid_i = (vint<4> *)(ulong)uVar6;
      if ((uVar6 == 0) ||
         (pIVar14 = (Intersectors *)((long)&pIVar13->ptr + 1),
         bVar21 = (Intersectors *)0x2 < pIVar13, pIVar13 = pIVar14, valid_i = (vint<4> *)pIVar14,
         bVar21)) break;
    }
    auVar40._0_4_ = auVar39._0_4_ & auVar65._0_4_;
    auVar40._4_4_ = auVar39._4_4_ & auVar65._4_4_;
    auVar40._8_4_ = auVar39._8_4_ & auVar65._8_4_;
    auVar40._12_4_ = auVar39._12_4_ & auVar65._12_4_;
    iVar8 = movmskps((int)pIVar14,auVar40);
    if (iVar8 == 0) break;
  }
  uVar12 = CONCAT44(auVar40._4_4_,auVar40._0_4_);
  aVar41._0_8_ = uVar12 ^ 0xffffffffffffffff;
  aVar41._8_4_ = auVar40._8_4_ ^ 0xffffffff;
  aVar41._12_4_ = auVar40._12_4_ ^ 0xffffffff;
LAB_0023c855:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       ((undefined1  [16])terminated.field_0 | (undefined1  [16])aVar41);
  iVar8 = movmskps((int)uVar7,(undefined1  [16])terminated.field_0);
  if (iVar8 == 0xf) {
LAB_0023c882:
    iVar8 = 3;
  }
  else {
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                  (undefined1  [16])terminated.field_0);
    iVar8 = 0;
  }
LAB_0023c885:
  paVar17 = paVar18;
  if (iVar8 == 3) {
    auVar42._4_4_ = uVar83 & terminated.field_0.i[1];
    auVar42._0_4_ = uVar82 & terminated.field_0.i[0];
    auVar42._8_4_ = uVar85 & terminated.field_0.i[2];
    auVar42._12_4_ = uVar87 & terminated.field_0.i[3];
    auVar42 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar42);
    *(undefined1 (*) [16])(ray + 0x80) = auVar42;
    return;
  }
  goto LAB_0023c225;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }